

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugEventObject.cpp
# Opt level: O2

void __thiscall
JsrtDebugDocumentManager::ClearDebugDocument
          (JsrtDebugDocumentManager *this,ScriptContext *scriptContext)

{
  int iVar1;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar2;
  Utf8SourceInfo *this_00;
  BaseDictionary<unsigned_int,_Js::DebugDocument_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  DebugDocument *pDVar3;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar4;
  DebugDocument *obj;
  int last;
  long lVar5;
  ulong uVar6;
  int nextIndex;
  int i;
  
  if (scriptContext != (ScriptContext *)0x0) {
    pLVar4 = Memory::
             RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
             ::operator->(&scriptContext->sourceList);
    for (lVar5 = 0;
        lVar5 < (pLVar4->
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                ).count; lVar5 = lVar5 + 1) {
      pRVar2 = (pLVar4->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar5].ptr;
      if (((((ulong)pRVar2 & 1) == 0 && pRVar2 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
          && (this_00 = (Utf8SourceInfo *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef,
             this_00 != (Utf8SourceInfo *)0x0)) &&
         ((this_00->m_debugDocument).ptr != (DebugDocument *)0x0)) {
        obj = Js::Utf8SourceInfo::GetDebugDocument(this_00);
        this_01 = this->breakpointDebugDocumentDictionary;
        if (this_01 !=
            (BaseDictionary<unsigned_int,_Js::DebugDocument_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)0x0) {
          for (uVar6 = 0; uVar6 < this_01->bucketCount; uVar6 = uVar6 + 1) {
            if (this_01->buckets[uVar6] != -1) {
              iVar1 = this_01->buckets[uVar6];
              i = -1;
              while (last = i, i = iVar1, i != -1) {
                pDVar3 = this_01->entries[i].
                         super_DefaultHashedEntry<unsigned_int,_Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .super_KeyValueEntry<unsigned_int,_Js::DebugDocument_*>.
                         super_ValueEntry<Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>_>
                         .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>.value;
                iVar1 = this_01->entries[i].
                        super_DefaultHashedEntry<unsigned_int,_Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .super_KeyValueEntry<unsigned_int,_Js::DebugDocument_*>.
                        super_ValueEntry<Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>_>
                        .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>.next;
                if ((pDVar3 != (DebugDocument *)0x0) && (obj == pDVar3)) {
                  JsUtil::
                  BaseDictionary<unsigned_int,_Js::DebugDocument_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::RemoveAt(this_01,i,last,(uint)uVar6);
                  i = last;
                }
              }
            }
          }
        }
        Js::Utf8SourceInfo::ClearDebugDocument(obj->utf8SourceInfo,true);
        Memory::
        DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::DebugDocument>
                  (&Memory::HeapAllocator::Instance,obj);
      }
    }
  }
  return;
}

Assistant:

void JsrtDebugDocumentManager::ClearDebugDocument(Js::ScriptContext * scriptContext)
{
    if (scriptContext != nullptr)
    {
        scriptContext->MapScript([&](Js::Utf8SourceInfo* sourceInfo)
        {
            if (sourceInfo->HasDebugDocument())
            {
                Js::DebugDocument* debugDocument = sourceInfo->GetDebugDocument();

                // Remove the debugdocument from breakpoint dictionary
                if (this->breakpointDebugDocumentDictionary != nullptr)
                {
                    this->breakpointDebugDocumentDictionary->MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<UINT, Js::DebugDocument *> keyValue)
                    {
                        if (keyValue.Value() != nullptr && keyValue.Value() == debugDocument)
                        {
                            return true;
                        }
                        return false;
                    });
                }

                debugDocument->GetUtf8SourceInfo()->ClearDebugDocument();
                HeapDelete(debugDocument);
                debugDocument = nullptr;
            }
        });
    }
}